

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

char * sysbvm_tuple_bytesToCString(sysbvm_tuple_t tuple)

{
  size_t sVar1;
  char *__dest;
  char *cstring;
  size_t sizeToAllocate;
  size_t stringSize;
  sysbvm_tuple_t tuple_local;
  
  sVar1 = sysbvm_tuple_getSizeInBytes(tuple);
  __dest = (char *)malloc(sVar1 + 1);
  memcpy(__dest,(void *)(tuple + 0x10),sVar1 + 1);
  __dest[sVar1] = '\0';
  return __dest;
}

Assistant:

SYSBVM_API char *sysbvm_tuple_bytesToCString(sysbvm_tuple_t tuple)
{
    size_t stringSize = sysbvm_tuple_getSizeInBytes(tuple);
    size_t sizeToAllocate = stringSize + 1;
    char *cstring = (char*)malloc(sizeToAllocate);
    memcpy(cstring, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes, sizeToAllocate);
    cstring[stringSize] = 0;
    return cstring;
}